

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sound.cpp
# Opt level: O2

void __thiscall
XPMP2::SoundSystemXP::SetPosOrientation
          (SoundSystemXP *this,uint64_t sndId,Aircraft *ac,bool bDoOrientation)

{
  SoundFile *pSVar1;
  FMOD_RESULT FVar2;
  bool bVar3;
  SoundChannel *pSVar4;
  float fVar5;
  allocator<char> local_11f;
  allocator<char> local_11e;
  allocator<char> local_11d;
  float local_11c;
  float local_118;
  float local_114;
  string local_110;
  string local_f0;
  string local_d0;
  FMOD_VECTOR local_b0;
  FmodError local_a0;
  undefined8 local_40;
  float local_38;
  undefined8 local_30;
  float local_28;
  
  pSVar4 = SoundSystem::GetChn(&this->super_SoundSystem,sndId);
  if ((((pSVar4 != (SoundChannel *)0x0) && (gpXPLMSetAudioCone != (code *)0x0)) &&
      (pSVar4->pChn != (FMOD_CHANNEL *)0x0)) && (pSVar4->pSnd != (SoundFile *)0x0)) {
    local_30._0_4_ = (ac->drawInfo).x;
    local_30._4_4_ = (ac->drawInfo).y;
    local_28 = (ac->drawInfo).z;
    local_40._0_4_ = ac->v_x;
    local_40._4_4_ = ac->v_y;
    local_38 = ac->v_z;
    gFmodRes = (*gpXPLMSetAudioPosition)();
    if (gFmodRes != FMOD_OK) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d0,"gpXPLMSetAudioPosition(pChn->pChn, &fmodPos, &fmodVel)",
                 (allocator<char> *)&local_b0);
      FVar2 = gFmodRes;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f0,
                 "/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/Sound.cpp"
                 ,&local_11e);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_110,"SetPosOrientation",&local_11f);
      FmodError::FmodError(&local_a0,&local_d0,FVar2,&local_f0,0x249,&local_110);
      FmodError::LogErr(&local_a0);
      FmodError::~FmodError(&local_a0);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_d0);
    }
    if (bDoOrientation) {
      bVar3 = SoundFile::hasConeInfo(pSVar4->pSnd);
      if (bVar3) {
        local_114 = pSVar4->pSnd->coneDir;
        local_11c = (local_114 * 3.1415927) / 180.0;
        local_114 = local_114 + (ac->drawInfo).heading;
        local_118 = cosf(local_11c);
        local_118 = local_118 * (ac->drawInfo).pitch;
        fVar5 = sinf(local_11c);
        local_b0 = FmodHeadPitch2Vec(local_114,
                                     (local_118 - fVar5 * (ac->drawInfo).roll) +
                                     pSVar4->pSnd->conePitch);
        pSVar1 = pSVar4->pSnd;
        gFmodRes = (*gpXPLMSetAudioCone)
                             (pSVar1->coneInAngle,pSVar1->coneOutAngle,pSVar1->coneOutVol,
                              pSVar4->pChn);
        if (gFmodRes != FMOD_OK) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_d0,
                     "gpXPLMSetAudioCone(pChn->pChn, pChn->pSnd->coneInAngle, pChn->pSnd->coneOutAngle, pChn->pSnd->coneOutVol, &coneVec)"
                     ,&local_11e);
          FVar2 = gFmodRes;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_f0,
                     "/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/Sound.cpp"
                     ,&local_11f);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_110,"SetPosOrientation",&local_11d);
          FmodError::FmodError(&local_a0,&local_d0,FVar2,&local_f0,0x259,&local_110);
          FmodError::LogErr(&local_a0);
          FmodError::~FmodError(&local_a0);
          std::__cxx11::string::~string((string *)&local_110);
          std::__cxx11::string::~string((string *)&local_f0);
          std::__cxx11::string::~string((string *)&local_d0);
        }
      }
    }
  }
  return;
}

Assistant:

void SoundSystemXP::SetPosOrientation (uint64_t sndId, const Aircraft& ac, bool bDoOrientation)
{
    SoundChannel* pChn = GetChn(sndId);
    if (!XPSoundIsAvail() || !pChn || !pChn->pChn || !pChn->pSnd ) return;
    
    // Aircraft position and velocity
    FMOD_VECTOR fmodPos {                           // Copy of the aircraft's 3D location
        ac.drawInfo.x,
        ac.drawInfo.y,
        ac.drawInfo.z,
    };
    FMOD_VECTOR fmodVel { ac.v_x, ac.v_y, ac.v_z }; // Copy of the aircraft's relative speed
    FMOD_LOG(gpXPLMSetAudioPosition(pChn->pChn, &fmodPos, &fmodVel));
    
    // Do the (computationally more expensive) orientation stuff?
    if (!bDoOrientation ||
        !pChn->pSnd->hasConeInfo()) return;
    
    // Calculate current cone orientation based on standard orientation and aircraft orientation
    const float coneDirRad = deg2rad(pChn->pSnd->coneDir);
    FMOD_VECTOR coneVec = FmodHeadPitch2Vec(ac.GetHeading() + pChn->pSnd->coneDir,
                                            std::cos(coneDirRad)*ac.GetPitch() - std::sin(coneDirRad)*ac.GetRoll() + pChn->pSnd->conePitch);

    // Set cone info and orientation
    FMOD_LOG(gpXPLMSetAudioCone(pChn->pChn,
                                pChn->pSnd->coneInAngle,
                                pChn->pSnd->coneOutAngle,
                                pChn->pSnd->coneOutVol,
                                &coneVec));
}